

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog.h
# Opt level: O0

void spdlog::warn<char[26]>(char (*msg) [26])

{
  logger *this;
  char (*msg_local) [26];
  
  this = default_logger_raw();
  logger::warn<char[26]>(this,msg);
  return;
}

Assistant:

inline void warn(const T &msg)
{
    default_logger_raw()->warn(msg);
}